

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::horizontalScrollbarValueChanged(QAbstractItemView *this,int value)

{
  int iVar1;
  QAbstractItemViewPrivate *pQVar2;
  ulong uVar3;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QPoint posInVp;
  QAbstractItemModel *in_stack_ffffffffffffff70;
  QPoint *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar4;
  QRect local_58;
  undefined8 local_48;
  QPoint local_40;
  QPersistentModelIndex local_38 [3];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractItemView *)0x80ae24);
  QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff70);
  iVar1 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff70);
  bVar4 = 0;
  if (iVar1 == in_ESI) {
    in_stack_ffffffffffffff78 = (QPoint *)pQVar2->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
    bVar4 = (**(code **)((long)*in_stack_ffffffffffffff78 + 0x130))
                      (in_stack_ffffffffffffff78,local_20);
  }
  if ((bVar4 & 1) != 0) {
    in_stack_ffffffffffffff70 = pQVar2->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
    (**(code **)(*(long *)in_stack_ffffffffffffff70 + 0x128))(in_stack_ffffffffffffff70,local_38);
  }
  local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff70);
  local_48 = QCursor::pos();
  local_40 = QWidget::mapFromGlobal(in_RDI,in_stack_ffffffffffffff78);
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff70);
  local_58 = QWidget::rect((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff88));
  uVar3 = QRect::contains((QPoint *)&local_58,SUB81(&local_40,0));
  if ((uVar3 & 1) != 0) {
    QAbstractItemViewPrivate::checkMouseMove
              ((QAbstractItemViewPrivate *)CONCAT17(bVar4,in_stack_ffffffffffffff88),
               (QPoint *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::horizontalScrollbarValueChanged(int value)
{
    Q_D(QAbstractItemView);
    if (horizontalScrollBar()->maximum() == value && d->model->canFetchMore(d->root))
        d->model->fetchMore(d->root);
    QPoint posInVp = viewport()->mapFromGlobal(QCursor::pos());
    if (viewport()->rect().contains(posInVp))
        d->checkMouseMove(posInVp);
}